

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall
FunctionCallNode::FunctionCallNode
          (FunctionCallNode *this,string *name,
          list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
          *arguments)

{
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *in_RDX;
  string *in_RSI;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *in_RDI;
  
  CallNode::CallNode((CallNode *)in_RDI);
  (in_RDI->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&PTR__FunctionCallNode_002b1b00;
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->
              super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              )._M_impl._M_node._M_size,in_RSI);
  std::__cxx11::
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::list
            (in_RDI,in_RDX);
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}